

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawListSplitter::ClearFreeMemory(ImDrawListSplitter *this)

{
  undefined8 *puVar1;
  uint uVar2;
  ImDrawChannel *pIVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar2 = (this->_Channels).Size;
  uVar6 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      iVar5 = (int)uVar6;
      if (uVar8 == (uint)this->_Current) {
        pIVar3 = (this->_Channels).Data;
        puVar1 = (undefined8 *)((long)&(pIVar3->_IdxBuffer).Size + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)&(pIVar3->_CmdBuffer).Size + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        iVar5 = (this->_Channels).Size;
      }
      if ((long)iVar5 <= (long)uVar8) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      pIVar3 = (this->_Channels).Data;
      pvVar4 = *(void **)((long)&(pIVar3->_CmdBuffer).Data + lVar7);
      if (pvVar4 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar3->_CmdBuffer).Size + lVar7) = 0;
        ImGui::MemFree(pvVar4);
        *(undefined8 *)((long)&(pIVar3->_CmdBuffer).Data + lVar7) = 0;
      }
      if ((long)(this->_Channels).Size <= (long)uVar8) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      pIVar3 = (this->_Channels).Data;
      pvVar4 = *(void **)((long)&(pIVar3->_IdxBuffer).Data + lVar7);
      if (pvVar4 != (void *)0x0) {
        *(undefined8 *)((long)&(pIVar3->_IdxBuffer).Size + lVar7) = 0;
        ImGui::MemFree(pvVar4);
        *(undefined8 *)((long)&(pIVar3->_IdxBuffer).Data + lVar7) = 0;
      }
      uVar8 = uVar8 + 1;
      uVar6 = (ulong)(this->_Channels).Size;
      lVar7 = lVar7 + 0x20;
    } while ((long)uVar8 < (long)uVar6);
  }
  this->_Current = 0;
  this->_Count = 1;
  pIVar3 = (this->_Channels).Data;
  if (pIVar3 != (ImDrawChannel *)0x0) {
    (this->_Channels).Size = 0;
    (this->_Channels).Capacity = 0;
    ImGui::MemFree(pIVar3);
    (this->_Channels).Data = (ImDrawChannel *)0x0;
  }
  return;
}

Assistant:

void ImDrawListSplitter::ClearFreeMemory()
{
    for (int i = 0; i < _Channels.Size; i++)
    {
        if (i == _Current)
            memset(&_Channels[i], 0, sizeof(_Channels[i]));  // Current channel is a copy of CmdBuffer/IdxBuffer, don't destruct again
        _Channels[i]._CmdBuffer.clear();
        _Channels[i]._IdxBuffer.clear();
    }
    _Current = 0;
    _Count = 1;
    _Channels.clear();
}